

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.hpp
# Opt level: O0

cx_string<3UL>
mserialize::detail::BuiltinTag<std::vector<std::tuple<>,_std::allocator<std::tuple<>_>_>,_void>::
tag_string(void)

{
  cx_string<3UL> cVar1;
  cx_string<2UL> *in_stack_00000040;
  cx_string<1UL> *in_stack_00000048;
  char (*in_stack_ffffffffffffffe8) [2];
  
  make_cx_string<2UL>(in_stack_ffffffffffffffe8);
  BuiltinTag<std::tuple<>,_void>::tag_string();
  cVar1 = cx_strcat<1ul,2ul>(in_stack_00000048,in_stack_00000040);
  return (cx_string<3UL>)cVar1._data;
}

Assistant:

static constexpr auto tag_string()
  {
    return cx_strcat(
      make_cx_string("["),
      Tag<sequence_value_t<Sequence>>::type::tag_string()
    );
  }